

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall PeleLM::initData(PeleLM *this)

{
  Geometry *a_level_geom;
  double *pdVar1;
  uint uVar2;
  double *pdVar3;
  double dVar4;
  uint uVar5;
  pointer pSVar6;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_01;
  StateData *this_02;
  MultiFab *pMVar7;
  Real RVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  ProbParm *pPVar15;
  DataContainer *pDVar16;
  Long LVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  TimeCenter TVar22;
  int *piVar23;
  long *plVar24;
  int n;
  double *pdVar25;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  ulong uVar33;
  BoxArray *pBVar34;
  undefined4 uVar35;
  uint uVar36;
  long lVar37;
  BoxArray *pBVar38;
  int i_3;
  ulong uVar39;
  long lVar40;
  uint uVar41;
  ulong uVar42;
  long lVar43;
  uint uVar44;
  Real *pRVar45;
  ulong uVar46;
  long lVar47;
  int iVar48;
  ProbParm *pPVar49;
  Real *pRVar50;
  bool bVar51;
  byte bVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  string pltfile;
  Real L_y;
  Real z;
  string velocity_plotfile;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  plotnames;
  PltFileManager pltData;
  string firstChars;
  MFIter mfi;
  MFIter mfi_1;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  MultiFab speciesPlt;
  ParmParse pp;
  long local_850;
  ulong local_848;
  ulong local_818;
  string local_810;
  Real local_7f0;
  undefined **local_7e8;
  double local_7e0;
  PeleLM *local_7d8;
  uint local_7cc;
  long local_7c8;
  ulong local_7c0;
  undefined **local_7b8;
  double local_7b0;
  double local_7a8;
  Array4<double> *local_7a0;
  long local_798;
  Real *local_790;
  ulong local_788;
  Real local_780;
  double local_778;
  double local_770;
  double local_768;
  double local_760;
  ProbParm *local_758;
  int local_74c;
  undefined1 local_748 [16];
  undefined1 local_738 [16];
  undefined1 local_728 [16];
  undefined1 local_718 [16];
  undefined1 local_708 [16];
  double local_6f8;
  double dStack_6f0;
  double local_6e8;
  double dStack_6e0;
  double local_6d8;
  double dStack_6d0;
  double local_6c8;
  double dStack_6c0;
  double local_6b8;
  double dStack_6b0;
  double local_6a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_698;
  Real local_680;
  undefined1 local_678 [32];
  undefined8 local_658;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_650;
  double local_638;
  Real RStack_630;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_628;
  pointer pGStack_610;
  pointer local_608;
  pointer pGStack_600;
  undefined1 local_5f8 [16];
  pointer local_5e8;
  vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> vStack_5e0;
  vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> local_5c8;
  undefined1 local_5a8 [24];
  Array4<double> *local_590;
  Real local_588;
  Real local_580;
  Box local_574;
  undefined1 local_558 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_548;
  double dStack_530;
  double local_528;
  double dStack_520;
  double local_518;
  double dStack_510;
  double local_508;
  double dStack_500;
  double local_4f8;
  double dStack_4f0;
  double local_4e8;
  double dStack_4e0;
  double local_4d8;
  double dStack_4d0;
  double local_4c8;
  double dStack_4c0;
  double local_4b8;
  double local_4b0;
  double dStack_4a8;
  double local_4a0;
  string local_3c8;
  string local_3a8;
  Array4<double> local_388;
  Real local_348;
  undefined8 uStack_340;
  undefined1 local_338 [20];
  int iStack_324;
  int local_318;
  int local_310;
  undefined1 local_2d8 [32];
  int local_2b8 [2];
  int local_2b0;
  Vector<int,_std::allocator<int>_> *local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [4];
  element_type *local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  element_type *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  element_type *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_190;
  pointer local_188;
  pointer piStack_180;
  pointer local_178;
  _Bit_type *p_Stack_170;
  undefined8 local_168;
  ParmParse local_88;
  undefined1 *__s;
  
  pPVar15 = prob_parm_d;
  pPVar49 = prob_parm;
  bVar52 = 0;
  prob_parm_d->pertmag = prob_parm->pertmag;
  uVar12 = *(undefined4 *)((long)&pPVar49->P_mean + 4);
  uVar35 = *(undefined4 *)&pPVar49->standoff;
  uVar13 = *(undefined4 *)((long)&pPVar49->standoff + 4);
  *(undefined4 *)&pPVar15->P_mean = *(undefined4 *)&pPVar49->P_mean;
  *(undefined4 *)((long)&pPVar15->P_mean + 4) = uVar12;
  *(undefined4 *)&pPVar15->standoff = uVar35;
  *(undefined4 *)((long)&pPVar15->standoff + 4) = uVar13;
  pSVar6 = (this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar6->new_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       pSVar6[1].new_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  local_558._0_8_ = &local_548;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"peleLM","");
  amrex::ParmParse::ParmParse(&local_88,(string *)local_558);
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_558._0_8_ != &local_548) {
    operator_delete((void *)local_558._0_8_,
                    (ulong)((long)local_548.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  iVar18 = amrex::ParmParse::countval(&local_88,"initDataPlt",-1);
  local_7d8 = this;
  if (iVar18 < 1) {
    local_7b8 = (undefined **)(this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[0];
    local_680 = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[1];
    local_588 = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[2];
    dVar4 = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xhi[0];
    local_7f0 = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xhi[1];
    local_780 = (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.dx[0];
    local_580 = (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.dx[1];
    local_348 = (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.dx[2];
    uStack_340 = 0;
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
               *(int *)((long)this_00.
                              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc),
               (IntVect *)
               ((long)this_00.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
               *(int *)((long)this_01.
                              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc),
               (IntVect *)
               ((long)this_01.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
    pDVar16 = pmf_data.m_data_d;
    pPVar49 = prob_parm_d;
    amrex::FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
    local_590 = ((MultiArray4<double> *)
                ((long)this_00.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0x128))->hp;
    local_388.p = (double *)0x0;
    local_388.jstride._0_4_ = 0;
    local_558._0_3_ = 0x10000;
    local_558._4_4_ = amrex::Gpu::Device::max_gpu_streams;
    local_558._0_2_ = 1;
    local_558._8_8_ = amrex::FabArrayBase::mfiter_tile_size;
    local_548.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_548.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,DAT_0083cec0);
    amrex::MFIter::MFIter
              ((MFIter *)local_2d8,
               (FabArrayBase *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(MFItInfo *)local_558);
    if (local_2b8[0] < local_2b0) {
      dVar4 = dVar4 - (double)local_7b8;
      local_7f0 = local_7f0 - local_680;
      local_5a8._8_4_ = SUB84(local_348 * -0.5,0);
      local_5a8._0_8_ = local_348 * 0.5;
      local_5a8._12_4_ = (int)((ulong)(local_348 * -0.5) >> 0x20);
      local_758 = pPVar49;
      do {
        amrex::MFIter::growntilebox((Box *)local_338,(MFIter *)local_2d8,(IntVect *)&local_388);
        piVar23 = (int *)(local_2d8 + 0x20);
        if (local_298 != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar23 = (local_298->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_2b8[0];
        }
        local_788 = local_338._8_8_ & 0xffffffff;
        local_74c = iStack_324;
        if ((int)local_338._8_4_ <= iStack_324) {
          local_7c0 = CONCAT44(local_7c0._4_4_,local_338._0_4_);
          local_7cc = local_338._4_4_;
          uVar12 = local_338._12_4_;
          local_7c8 = CONCAT44(local_7c8._4_4_,local_338._16_4_);
          local_7a0 = local_590 + *piVar23;
          do {
            if ((int)local_7cc <= (int)local_7c8) {
              local_798 = (long)(int)local_788;
              local_7a8 = ((double)(int)local_788 + 0.5) * local_348 + local_588;
              local_7e8 = (undefined **)(ulong)local_7cc;
              do {
                if ((int)local_7c0 <= (int)uVar12) {
                  local_790 = (Real *)(long)(int)local_7e8;
                  dVar10 = ((double)(int)local_7e8 + 0.5) * local_580 + local_680;
                  local_7e0 = (dVar10 * 31.41592653589793) / local_7f0;
                  local_7b0 = ((dVar10 + -0.0053765) * 25.132741228718345) / local_7f0;
                  local_778 = ((dVar10 + -0.02137) * 18.84955592153876) / local_7f0;
                  local_770 = ((dVar10 + -0.018) * 37.69911184307752) / local_7f0;
                  local_848 = local_7c0 & 0xffffffff;
                  do {
                    memset(local_558,0,200);
                    __s = local_748;
                    memset(__s,0,0xa8);
                    uVar35 = SUB84(__s,0);
                    dVar10 = 0.0;
                    if (0.0 < pPVar49->pertmag) {
                      dVar10 = ((double)(int)local_848 + 0.5) * local_780 + (double)local_7b8;
                      local_760 = pPVar49->pertmag;
                      dVar58 = sin((dVar10 * 25.132741228718345) / dVar4);
                      dVar11 = sin(local_7e0);
                      local_768 = sin(((dVar10 + -0.004598) * 12.566370614359172) / dVar4);
                      local_768 = local_768 * 1.023;
                      dVar53 = sin(local_7b0);
                      dVar53 = dVar53 * local_768;
                      dVar54 = sin(((dVar10 + -0.00712435) * 18.84955592153876) / dVar4);
                      dVar55 = sin(local_778);
                      dVar56 = sin(((dVar10 + -0.0033) * 31.41592653589793) / dVar4);
                      dVar57 = sin(local_770);
                      dVar10 = sin(((dVar10 + -0.014234) * 31.41592653589793) / dVar4);
                      dVar10 = local_760 *
                               (dVar10 * 0.982 +
                               dVar57 * dVar56 * 1.017 +
                               dVar55 * dVar54 * 0.945 + dVar11 * dVar58 + dVar53);
                    }
                    dVar11 = local_7a8 - pPVar49->standoff;
                    dVar58 = (dVar10 + dVar11 + (double)local_5a8._0_8_) * 100.0;
                    dVar10 = (dVar10 + dVar11 + (double)local_5a8._8_8_) * 100.0;
                    uVar2 = pDVar16->m_nPoint;
                    uVar30 = (ulong)(uVar2 - 1);
                    if (pDVar16->m_doAverage == 0) {
                      dVar58 = (dVar58 + dVar10) * 0.5;
                      pdVar3 = pDVar16->pmf_X;
                      uVar46 = (ulong)-(uint)(*pdVar3 <= dVar58);
                      if (pdVar3[uVar30] <= dVar58 && dVar58 != pdVar3[uVar30]) {
                        uVar46 = uVar30;
                      }
                      uVar28 = (uint)uVar46;
                      uVar36 = uVar28;
                      if (uVar28 == 0xffffffff) {
                        uVar33 = 0xffffffff;
                        uVar36 = 0xffffffff;
                        if (uVar30 != 0) {
                          uVar39 = 0;
                          do {
                            if ((pdVar3[uVar39] <= dVar58) && (dVar58 <= pdVar3[uVar39 + 1])) {
                              uVar46 = (ulong)((int)uVar39 + 1);
                              uVar33 = uVar39 & 0xffffffff;
                            }
                            uVar28 = (uint)uVar46;
                            uVar39 = uVar39 + 1;
                            uVar36 = (uint)uVar33;
                          } while (uVar30 != uVar39);
                        }
                      }
                      uVar5 = pDVar16->m_nVar;
                      if (uVar5 != 0) {
                        dVar58 = pdVar3[(int)uVar36];
                        pRVar45 = pDVar16->pmf_Y;
                        uVar41 = 0;
                        uVar29 = uVar28;
                        uVar44 = uVar36;
                        do {
                          dVar11 = pRVar45[uVar44];
                          dVar53 = 0.0;
                          if (uVar36 != uVar28) {
                            dVar53 = (pRVar45[uVar29] - dVar11) / (pdVar3[(int)uVar28] - dVar58);
                          }
                          *(double *)(local_558 + (long)(int)uVar41 * 8) =
                               dVar53 * (dVar10 - dVar58) + dVar11;
                          uVar41 = uVar41 + 1;
                          uVar29 = uVar29 + uVar2;
                          uVar44 = uVar44 + uVar2;
                        } while (uVar5 != uVar41);
                      }
                    }
                    else {
                      pdVar3 = pDVar16->pmf_X;
                      lVar32 = -(ulong)(pdVar3[uVar30] < dVar10);
                      auVar9._8_4_ = (int)lVar32;
                      auVar9._0_8_ = -(ulong)(pdVar3[uVar30] < dVar58);
                      auVar9._12_4_ = (int)((ulong)lVar32 >> 0x20);
                      uVar36 = movmskpd(uVar35,auVar9);
                      uVar46 = (ulong)-(uint)(*pdVar3 <= dVar10);
                      if ((uVar36 & 2) != 0) {
                        uVar46 = uVar30;
                      }
                      uVar33 = (ulong)-(uint)(*pdVar3 <= dVar58);
                      if ((uVar36 & 1) != 0) {
                        uVar33 = uVar30;
                      }
                      iVar19 = (int)uVar33;
                      iVar18 = (int)uVar46;
                      if (iVar18 == -1) {
                        uVar39 = 0xffffffff;
                        iVar18 = -1;
                        if (uVar30 != 0) {
                          uVar42 = 0;
                          do {
                            if ((pdVar3[uVar42] <= dVar10) && (dVar10 <= pdVar3[uVar42 + 1])) {
                              uVar46 = (ulong)((int)uVar42 + 1);
                              uVar39 = uVar42 & 0xffffffff;
                            }
                            iVar18 = (int)uVar39;
                            uVar42 = uVar42 + 1;
                          } while (uVar30 != uVar42);
                        }
                      }
                      iVar20 = iVar19;
                      if (iVar19 == -1) {
                        uVar39 = 0xffffffff;
                        iVar20 = -1;
                        if (uVar30 != 0) {
                          uVar42 = 0;
                          do {
                            if ((pdVar3[uVar42] <= dVar58) && (dVar58 <= pdVar3[uVar42 + 1])) {
                              uVar33 = (ulong)((int)uVar42 + 1);
                              uVar39 = uVar42 & 0xffffffff;
                            }
                            iVar19 = (int)uVar33;
                            uVar42 = uVar42 + 1;
                            iVar20 = (int)uVar39;
                          } while (uVar30 != uVar42);
                        }
                      }
                      uVar36 = pDVar16->m_nVar;
                      if (uVar36 != 0) {
                        dVar11 = pdVar3[iVar18];
                        pRVar45 = pDVar16->pmf_Y;
                        iVar21 = (int)uVar46;
                        dVar53 = pdVar3[iVar21];
                        uVar28 = 0;
                        do {
                          iVar31 = uVar28 * uVar2;
                          dVar54 = pRVar45[(uint)(iVar18 + iVar31)];
                          dVar55 = 0.0;
                          if (iVar18 != iVar21) {
                            dVar55 = (pRVar45[(uint)(iVar21 + iVar31)] - dVar54) / (dVar53 - dVar11)
                            ;
                          }
                          dVar56 = dVar55 * (dVar10 - dVar11) + dVar54;
                          iVar48 = (int)uVar46;
                          if (iVar18 == iVar20) {
                            dVar54 = (dVar56 + dVar55 * (dVar58 - dVar11) + dVar54) * 0.5;
                          }
                          else {
                            dVar54 = pRVar45[(uint)(iVar20 + iVar31)];
                            dVar55 = 0.0;
                            if (iVar20 != iVar19) {
                              dVar55 = (pRVar45[(uint)(iVar31 + iVar19)] - dVar54) /
                                       (pdVar3[iVar19] - pdVar3[iVar20]);
                            }
                            dVar57 = dVar58 - pdVar3[iVar20];
                            dVar54 = (dVar55 * dVar57 + dVar54 + dVar54) * dVar57 * 0.5 +
                                     (pRVar45[(uint)(iVar21 + iVar31)] + dVar56) *
                                     (dVar53 - dVar10) * 0.5;
                            lVar32 = (long)iVar21;
                            if (iVar21 < iVar20) {
                              do {
                                lVar47 = lVar32 + 1;
                                pdVar25 = pdVar3 + lVar32;
                                lVar32 = lVar32 + 1;
                                pdVar1 = pRVar45 + uVar46;
                                uVar46 = (ulong)((int)uVar46 + 1);
                                dVar54 = dVar54 + (*pdVar1 + pRVar45[uVar46]) *
                                                  (pdVar3[lVar47] - *pdVar25) * 0.5;
                              } while (iVar20 != lVar32);
                            }
                            dVar54 = dVar54 / (dVar58 - dVar10);
                          }
                          *(double *)(local_558 + (long)(int)uVar28 * 8) = dVar54;
                          uVar28 = uVar28 + 1;
                          uVar46 = (ulong)(iVar48 + uVar2);
                        } while (uVar28 != uVar36);
                      }
                    }
                    lVar47 = (long)(int)local_848;
                    lVar43 = lVar47 - (local_7a0->begin).x;
                    lVar37 = ((long)local_790 - (long)(local_7a0->begin).y) * local_7a0->jstride;
                    lVar27 = (local_798 - (local_7a0->begin).z) * local_7a0->kstride;
                    lVar32 = local_7a0->nstride;
                    pdVar3 = local_7a0->p;
                    pdVar3[lVar37 + lVar43 + lVar27 + lVar32 * 0x1a] = (double)local_558._0_8_;
                    dVar58 = 1.0 / (dStack_4a8 * 28.014 +
                                    local_4b0 * 30.07 +
                                    local_4b8 * 29.062 +
                                    dStack_4c0 * 28.054 +
                                    local_4c8 * 31.034 +
                                    dStack_4d0 * 30.026 +
                                    local_4d8 * 29.018 +
                                    dStack_4e0 * 44.009 +
                                    local_4e8 * 28.01 +
                                    dStack_4f0 * 16.043 +
                                    local_4f8 * 15.035 +
                                    dStack_500 * 14.027 +
                                    local_508 * 14.027 +
                                    dStack_510 * 33.006 +
                                    local_518 * 18.015 +
                                    dStack_520 * 17.007 +
                                    local_528 * 31.998 +
                                    dStack_530 * 15.999 +
                                    (double)local_548.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage *
                                    1.008 + (double)local_548.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish * 2.016
                                            + 0.0 + local_4a0 * 39.95);
                    local_748._0_8_ =
                         (_func_int **)
                         ((double)local_548.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish * 2.016 * dVar58);
                    local_748._8_8_ =
                         (double)local_548.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage * 1.008 * dVar58
                    ;
                    dVar10 = local_528 * 31.998 * dVar58;
                    local_738._8_4_ = SUB84(dVar10,0);
                    local_738._0_8_ = dStack_530 * 15.999 * dVar58;
                    local_738._12_4_ = (int)((ulong)dVar10 >> 0x20);
                    dVar10 = local_518 * 18.015 * dVar58;
                    local_728._8_4_ = SUB84(dVar10,0);
                    local_728._0_8_ = dStack_520 * 17.007 * dVar58;
                    local_728._12_4_ = (int)((ulong)dVar10 >> 0x20);
                    dVar10 = local_508 * 14.027 * dVar58;
                    local_718._8_4_ = SUB84(dVar10,0);
                    local_718._0_8_ = dStack_510 * 33.006 * dVar58;
                    local_718._12_4_ = (int)((ulong)dVar10 >> 0x20);
                    dVar10 = local_4f8 * 15.035 * dVar58;
                    local_708._8_4_ = SUB84(dVar10,0);
                    local_708._0_8_ = dStack_500 * 14.027 * dVar58;
                    local_708._12_4_ = (int)((ulong)dVar10 >> 0x20);
                    local_6f8 = dStack_4f0 * 16.043 * dVar58;
                    dStack_6f0 = local_4e8 * 28.01 * dVar58;
                    local_6e8 = dStack_4e0 * 44.009 * dVar58;
                    dStack_6e0 = local_4d8 * 29.018 * dVar58;
                    local_6d8 = dStack_4d0 * 30.026 * dVar58;
                    dStack_6d0 = local_4c8 * 31.034 * dVar58;
                    local_6c8 = dStack_4c0 * 28.054 * dVar58;
                    dStack_6c0 = local_4b8 * 29.062 * dVar58;
                    local_6b8 = local_4b0 * 30.07 * dVar58;
                    dStack_6b0 = dStack_4a8 * 28.014 * dVar58;
                    local_6a8 = dVar58 * local_4a0 * 39.95;
                    pdVar3[lVar37 + lVar43 + lVar27] = 0.0;
                    pdVar3[lVar37 + lVar43 + lVar27 + lVar32] = 0.0;
                    pdVar3[lVar37 + lVar43 + lVar27 + lVar32 * 2] = (double)local_558._8_8_ * 0.01;
                    dVar10 = local_758->P_mean;
                    dVar58 = pdVar3[lVar37 + lVar43 + lVar27 + lVar32 * 0x1a];
                    local_678._0_8_ = (pointer)0x3fdfbefbefbefbf0;
                    local_678._8_8_ = 0x3fefbefbefbefbf0;
                    local_678._16_8_ = 0x3fb000418a43bf8c;
                    local_678._24_8_ = 0x3fa000418a43bf8c;
                    local_658._0_4_ = -0x48f1ed02;
                    local_658._4_4_ = 0x3fae1af1;
                    vStack_650.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fac6bb6f569cbd9;
                    vStack_650.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f9f065042c3dbd3;
                    vStack_650.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3fb24021df7a429e
                    ;
                    local_638 = 0.07129108148570615;
                    RStack_630 = 0.06651147322913202;
                    local_628.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x3fafea0b02aa32d7;
                    local_628.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3fa24778bbe8f7dd;
                    local_628.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3f9744998b9a1c0d;
                    pGStack_610 = (pointer)0x3fa1a4eba7fd99b3;
                    local_608 = (pointer)0x3fa10d488e47ecc4;
                    pGStack_600 = (pointer)0x3fa07f7f2eefd932;
                    local_5f8._8_8_ = 0x3fa19e14f6ff5920;
                    local_5f8._0_8_ = 0x3fa24021df7a429e;
                    local_5e8 = (pointer)0x3fa106e55a53f15b;
                    vStack_5e0.
                    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fa246cdaf410bdd;
                    vStack_5e0.
                    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f99a1cd6070c7ee;
                    lVar40 = 0;
                    do {
                      *(double *)(local_208 + lVar40 * 8) =
                           *(double *)(local_748 + lVar40 * 8) * *(double *)(local_678 + lVar40 * 8)
                      ;
                      lVar40 = lVar40 + 1;
                    } while (lVar40 != 0x15);
                    dVar11 = 0.0;
                    lVar40 = 0;
                    do {
                      dVar11 = dVar11 + *(double *)(local_208 + lVar40 * 8);
                      lVar40 = lVar40 + 1;
                    } while (lVar40 != 0x15);
                    pdVar3[lVar37 + lVar43 + lVar27 + lVar32 * 3] =
                         ((dVar10 * 10.0) / (dVar58 * 83144626.1815324 * dVar11)) * 1000.0;
                    dVar10 = pdVar3[lVar37 + lVar43 + lVar27 + lVar32 * 0x1a];
                    dVar53 = dVar10 * dVar10;
                    dVar11 = dVar10 * dVar53;
                    dVar58 = dVar10 * dVar11;
                    local_208._0_8_ = (_func_int **)0x3fdfbefbefbefbf0;
                    local_208._8_8_ = 0x3fefbefbefbefbf0;
                    local_1f8[0]._M_allocated_capacity = 0x3fb000418a43bf8c;
                    local_1f8[0]._8_8_ = 0x3fa000418a43bf8c;
                    local_1f8[1]._0_8_ = 0x3fae1af1b70e12fe;
                    local_1f8[1]._8_8_ = 0x3fac6bb6f569cbd9;
                    local_1f8[2]._0_8_ = 0x3f9f065042c3dbd3;
                    local_1f8[2]._8_8_ = 0x3fb24021df7a429e;
                    local_1f8[3]._0_8_ = 0x3fb24021df7a429e;
                    local_1f8[3]._8_8_ = 0x3fb106e55a53f15b;
                    local_1b8 = (element_type *)0x3fafea0b02aa32d7;
                    _Stack_1b0._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fa24778bbe8f7dd;
                    local_1a8 = (element_type *)0x3f9744998b9a1c0d;
                    _Stack_1a0._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fa1a4eba7fd99b3;
                    local_198 = (element_type *)0x3fa10d488e47ecc4;
                    _Stack_190._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fa07f7f2eefd932;
                    local_188 = (pointer)0x3fa24021df7a429e;
                    piStack_180 = (pointer)0x3fa19e14f6ff5920;
                    local_178 = (pointer)0x3fa106e55a53f15b;
                    p_Stack_170 = (_Bit_type *)0x3fa246cdaf410bdd;
                    local_168._0_4_ = 0x6070c7ee;
                    local_168._4_4_ = 0x3f99a1cd;
                    dVar54 = 1.0 / dVar10;
                    if (1000.0 <= dVar10) {
                      local_678._0_8_ =
                           (pointer)(dVar54 * -950.158922 +
                                    dVar58 * 4.00510752e-15 +
                                    dVar11 * -4.48915985e-11 +
                                    dVar53 * 1.66485593e-07 + dVar10 * -2.47012365e-05 + 3.3372792);
                      local_678._8_8_ =
                           dVar54 * 25473.6599 +
                           dVar58 * 9.96394714e-23 +
                           dVar11 * -1.18378809e-18 +
                           dVar53 * 5.38539827e-15 + dVar10 * -1.15421486e-11 + 2.50000001;
                      local_678._16_8_ =
                           dVar54 * 29217.5791 +
                           dVar58 * 2.45667382e-16 +
                           dVar11 * -2.50444497e-12 +
                           dVar53 * 1.39828196e-08 + dVar10 * -4.29870569e-05 + 2.56942078;
                      local_678._24_8_ =
                           dVar54 * -1088.45772 +
                           dVar58 * -4.33435588e-15 +
                           dVar11 * 5.23676387e-11 +
                           dVar53 * -2.52655556e-07 + dVar10 * 0.00074154377 + 3.28253784;
                      local_658 = dVar54 * 3858.657 +
                                  dVar58 * 2.34824752e-15 +
                                  dVar11 * -2.19865389e-11 +
                                  dVar53 * 4.21684093e-08 + dVar10 * 0.000274214858 + 3.09288767;
                      vStack_650.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)(dVar54 * -30004.2971 +
                                    dVar58 * 3.36401984e-15 +
                                    dVar11 * -2.42604967e-11 +
                                    dVar53 * -5.46908393e-08 + dVar10 * 0.00108845902 + 3.03399249);
                      vStack_650.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)(dVar54 * 111.856713 +
                                    dVar58 * -2.1581707e-15 +
                                    dVar11 * 2.85615925e-11 +
                                    dVar53 * -2.11219383e-07 + dVar10 * 0.00111991006 + 4.0172109);
                      vStack_650.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)(dVar54 * 46263.604 +
                                    dVar58 * -3.75455134e-15 +
                                    dVar11 * 6.50448872e-11 +
                                    dVar53 * -4.69648657e-07 + dVar10 * 0.00182819646 + 2.87410113);
                      local_638 = dVar54 * 50925.9997 +
                                  dVar58 * -6.7943273e-15 +
                                  dVar11 * 1.044765e-10 +
                                  dVar53 * -6.70639823e-07 + dVar10 * 0.00232794318 + 2.29203842;
                      RStack_630 = dVar54 * 16775.5843 +
                                   dVar58 * -9.34308788e-15 +
                                   dVar11 * 1.48921161e-10 +
                                   dVar53 * -9.95714493e-07 + dVar10 * 0.00361995018 + 2.28571772;
                      local_628.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           (pointer)(dVar54 * -9468.34459 +
                                    dVar58 * -2.0363046e-14 +
                                    dVar11 * 3.05731338e-10 +
                                    dVar53 * -1.9109527e-06 + dVar10 * 0.00669547335 + 0.074851495);
                      local_628.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           (pointer)(dVar54 * -14151.8724 +
                                    dVar58 * -4.07295432e-15 +
                                    dVar11 * 5.7513252e-11 +
                                    dVar53 * -3.32941924e-07 + dVar10 * 0.00103126372 + 2.71518561);
                      local_628.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage =
                           (pointer)(dVar54 * -48759.166 +
                                    dVar58 * -9.44168328e-15 +
                                    dVar11 * 1.30872547e-10 +
                                    dVar53 * -7.38271347e-07 + dVar10 * 0.00220718513 + 3.85746029);
                      pGStack_610 = (pointer)(dVar54 * 4011.91815 +
                                             dVar58 * -1.06701742e-14 +
                                             dVar11 * 1.47290445e-10 +
                                             dVar53 * -8.28152043e-07 +
                                             dVar10 * 0.00247847763 + 2.77217438);
                      local_608 = (pointer)(dVar54 * -13995.8323 +
                                           dVar58 * -1.76771128e-14 +
                                           dVar11 * 2.5160303e-10 +
                                           dVar53 * -1.47419604e-06 +
                                           dVar10 * 0.00460000041 + 1.76069008);
                      pGStack_600 = (pointer)(dVar54 * 127.83252 +
                                             dVar58 * -4.225232e-15 +
                                             dVar11 * 9.8610775e-11 +
                                             dVar53 * -8.85461333e-07 +
                                             dVar10 * 0.0039357485 + 3.770799);
                      local_5f8._8_8_ =
                           dVar54 * 12857.52 +
                           dVar58 * -2.99283152e-14 +
                           dVar11 * 4.38044223e-10 +
                           dVar53 * -2.66068889e-06 + dVar10 * 0.0086986361 + 1.95465642;
                      local_5f8._0_8_ =
                           dVar54 * 4939.88614 +
                           dVar58 * -2.51412122e-14 +
                           dVar11 * 3.68057308e-10 +
                           dVar53 * -2.23692638e-06 + dVar10 * 0.00732270755 + 2.03611116;
                      local_5e8 = (pointer)(dVar54 * -11426.3932 +
                                           dVar58 * -3.8000578e-14 +
                                           dVar11 * 5.53530003e-10 +
                                           dVar53 * -3.3418689e-06 +
                                           dVar10 * 0.0108426339 + 1.0718815);
                      dVar56 = dVar58 * -1.3506702e-15 +
                               dVar11 * 2.5242595e-11 +
                               dVar53 * -1.89492e-07 + dVar10 * 0.0007439884 + 2.92664;
                      dVar55 = dVar54 * -922.7977;
                    }
                    else {
                      local_678._0_8_ =
                           (pointer)(dVar54 * -917.935173 +
                                    dVar58 * -1.47522352e-12 +
                                    dVar11 * 5.03930235e-09 +
                                    dVar53 * -6.492717e-06 + dVar10 * 0.00399026037 + 2.34433112);
                      local_678._8_8_ =
                           dVar54 * 25473.6599 +
                           dVar58 * -1.85546466e-22 +
                           dVar11 * 5.7520408e-19 +
                           dVar53 * -6.65306547e-16 + dVar10 * 3.52666409e-13 + 2.5;
                      local_678._16_8_ =
                           dVar54 * 29122.2592 +
                           dVar58 * 4.22531942e-13 +
                           dVar11 * -1.53201656e-09 +
                           dVar53 * 2.21435465e-06 + dVar10 * -0.00163965942 + 3.1682671;
                      local_678._24_8_ =
                           dVar54 * -1063.94356 +
                           dVar58 * 6.48745674e-13 +
                           dVar11 * -2.42032377e-09 +
                           dVar53 * 3.282434e-06 + dVar10 * -0.00149836708 + 3.78245636;
                      local_658 = dVar54 * 3615.08056 +
                                  dVar58 * 2.7282294e-13 +
                                  dVar11 * -9.70283332e-10 +
                                  dVar53 * 1.5393128e-06 + dVar10 * -0.00120065876 + 3.99201543;
                      vStack_650.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)(dVar54 * -30293.7267 +
                                    dVar58 * 3.54395634e-13 +
                                    dVar11 * -1.37199266e-09 +
                                    dVar53 * 2.17346737e-06 + dVar10 * -0.00101821705 + 4.19864056);
                      vStack_650.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)(dVar54 * 294.80804 +
                                    dVar58 * 1.85845025e-12 +
                                    dVar11 * -6.06909735e-09 +
                                    dVar53 * 7.05276303e-06 + dVar10 * -0.00237456025 + 4.30179801);
                      vStack_650.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)(dVar54 * 46004.0401 +
                                    dVar58 * 3.37483438e-13 +
                                    dVar11 * -9.62727883e-10 +
                                    dVar53 * 9.31632803e-07 + dVar10 * 0.000484436072 + 3.76267867);
                      local_638 = dVar54 * 50496.8163 +
                                  dVar58 * 3.88629474e-13 +
                                  dVar11 * -1.67203995e-09 +
                                  dVar53 * 2.74432073e-06 + dVar10 * -0.0011833071 + 4.19860411;
                      RStack_630 = dVar54 * 16444.9988 +
                                   dVar58 * 5.08771468e-13 +
                                   dVar11 * -1.71779356e-09 +
                                   dVar53 * 1.91007285e-06 + dVar10 * 0.00100547588 + 3.6735904;
                      local_628.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           (pointer)(dVar54 * -10246.6476 +
                                    dVar58 * 3.33387912e-12 +
                                    dVar11 * -1.21185757e-08 +
                                    dVar53 * 1.63933533e-05 + dVar10 * -0.0068354894 + 5.14987613);
                      local_628.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           (pointer)(dVar54 * -14344.086 +
                                    dVar58 * -1.808849e-13 +
                                    dVar11 * 2.26751471e-10 +
                                    dVar53 * 3.3893811e-07 + dVar10 * -0.00030517684 + 3.57953347);
                      local_628.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage =
                           (pointer)(dVar54 * -48371.9697 +
                                    dVar58 * -2.87399096e-14 +
                                    dVar11 * 6.14797555e-10 +
                                    dVar53 * -2.3745209e-06 + dVar10 * 0.00449229839 + 2.35677352);
                      pGStack_610 = (pointer)(dVar54 * 3839.56496 +
                                             dVar58 * 8.6753773e-13 +
                                             dVar11 * -3.32860233e-09 +
                                             dVar53 * 4.59331487e-06 +
                                             dVar10 * -0.00162196266 + 4.22118584);
                      local_608 = (pointer)(dVar54 * -14308.9567 +
                                           dVar58 * 2.63545304e-12 +
                                           dVar11 * -9.48213152e-09 +
                                           dVar53 * 1.24406669e-05 +
                                           dVar10 * -0.00495416684 + 4.79372315);
                      pGStack_600 = (pointer)(dVar54 * 978.6011 +
                                             dVar58 * 4.15122e-13 +
                                             dVar11 * -1.844409e-09 +
                                             dVar53 * 1.77949067e-06 +
                                             dVar10 * 0.0036082975 + 2.106204);
                      local_5f8._8_8_ =
                           dVar54 * 12841.6265 +
                           dVar58 * 4.61018008e-12 +
                           dVar11 * -1.49781651e-08 +
                           dVar53 * 1.65714269e-05 + dVar10 * -0.00209329446 + 4.30646568;
                      local_5f8._0_8_ =
                           dVar54 * 5089.77593 +
                           dVar58 * 5.39768746e-12 +
                           dVar11 * -1.72897188e-08 +
                           dVar53 * 1.90330097e-05 + dVar10 * -0.00378526124 + 3.95920148;
                      local_5e8 = (pointer)(dVar54 * -11522.2055 +
                                           dVar58 * 5.37371542e-12 +
                                           dVar11 * -1.77116571e-08 +
                                           dVar53 * 1.99812763e-05 +
                                           dVar10 * -0.00275077135 + 4.29142492);
                      dVar56 = dVar58 * -4.889708e-13 +
                               dVar11 * 1.41037875e-09 +
                               dVar53 * -1.321074e-06 + dVar10 * 0.0007041202 + 3.298677;
                      dVar55 = dVar54 * -1020.8999;
                    }
                    vStack_5e0.
                    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)(dVar55 + dVar56);
                    vStack_5e0.
                    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(dVar54 * -745.375 +
                                  dVar58 * 0.0 + dVar11 * 0.0 + dVar53 * 0.0 + dVar10 * 0.0 + 2.5);
                    lVar40 = 0;
                    do {
                      *(double *)(local_678 + lVar40 * 8) =
                           *(double *)(local_208 + lVar40 * 8) * dVar10 * 83144626.1815324 *
                           *(double *)(local_678 + lVar40 * 8);
                      lVar40 = lVar40 + 1;
                    } while (lVar40 != 0x15);
                    pdVar3[lVar37 + lVar43 + lVar27 + lVar32 * 0x19] = 0.0;
                    dVar10 = 0.0;
                    lVar40 = 0;
                    do {
                      dVar10 = dVar10 + *(double *)(local_748 + lVar40 * 8) *
                                        *(double *)(local_678 + lVar40 * 8);
                      lVar40 = lVar40 + 1;
                    } while (lVar40 != 0x15);
                    pdVar3[lVar37 + lVar43 + lVar27 + lVar32 * 0x19] = dVar10;
                    lVar37 = (long)(local_7a0->begin).x;
                    lVar43 = lVar47 - lVar37;
                    pdVar3 = local_7a0->p;
                    lVar32 = local_7a0->nstride;
                    lVar27 = ((long)local_790 - (long)(local_7a0->begin).y) * local_7a0->jstride;
                    lVar40 = (local_798 - (local_7a0->begin).z) * local_7a0->kstride;
                    pdVar3[lVar27 + lVar43 + lVar40 + lVar32 * 0x19] =
                         pdVar3[lVar27 + lVar43 + lVar40 + lVar32 * 0x19] * 0.0001 *
                         pdVar3[lVar27 + lVar43 + lVar40 + lVar32 * 3];
                    pdVar25 = pdVar3 + ((lVar40 + lVar27 + lVar47 + lVar32 * 4) - lVar37);
                    lVar47 = 0;
                    do {
                      *pdVar25 = *(double *)(local_748 + lVar47 * 8) *
                                 pdVar3[lVar27 + lVar43 + lVar40 + lVar32 * 3];
                      lVar47 = lVar47 + 1;
                      pdVar25 = pdVar25 + lVar32;
                    } while (lVar47 != 0x15);
                    bVar51 = (int)local_848 != uVar12;
                    this = local_7d8;
                    pPVar49 = local_758;
                    local_848 = (ulong)((int)local_848 + 1);
                  } while (bVar51);
                }
                iVar18 = (int)local_7e8;
                local_7e8 = (undefined **)(ulong)(iVar18 + 1);
              } while (iVar18 != (int)local_7c8);
            }
            iVar18 = (int)local_788;
            local_788 = (ulong)(iVar18 + 1);
          } while (iVar18 != local_74c);
        }
        amrex::MFIter::operator++((MFIter *)local_2d8);
      } while (local_2b8[0] < local_2b0);
    }
    amrex::MFIter::~MFIter((MFIter *)local_2d8);
  }
  else {
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
               *(int *)((long)this_00.
                              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc),
               (IntVect *)
               ((long)this_00.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
               *(int *)((long)this_01.
                              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc),
               (IntVect *)
               ((long)this_01.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
    local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
    local_810._M_string_length = 0;
    local_810.field_2._M_local_buf[0] = '\0';
    amrex::ParmParse::query(&local_88,"initDataPlt",&local_810,0);
    if (NavierStokesBase::verbose != 0) {
      local_558._8_8_ = amrex::OutStream();
      local_558._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
      local_558._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_548);
      *(undefined8 *)
       ((long)&local_548.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       *(size_type *)
        ((long)local_548.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start - 0x18)) =
           *(undefined8 *)
            ((long)&((ArenaInfo *)(local_558._8_8_ + 8))->release_threshold +
            (long)(*(_func_int ***)local_558._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_548,"initData: reading data from: ",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_548,local_810._M_dataplus._M_p,local_810._M_string_length);
      local_208[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_548,local_208,1);
      amrex::Print::~Print((Print *)local_558);
    }
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a8,local_810._M_dataplus._M_p,
               local_810._M_dataplus._M_p + local_810._M_string_length);
    pele::physics::pltfilemanager::PltFileManager::PltFileManager
              ((PltFileManager *)local_678,&local_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_698,&vStack_650);
    local_228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
              ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_228);
    if (local_698.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_698.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ||
        (long)local_698.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_698.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start < 0) {
      iVar19 = -1;
      local_850 = -1;
      uVar2 = 0;
      iVar18 = -1;
    }
    else {
      lVar32 = 0;
      iVar18 = -1;
      uVar46 = 0;
      local_850._0_4_ = -1;
      uVar2 = 0;
      uVar30 = 0xffffffff;
      do {
        std::__cxx11::string::substr
                  ((ulong)local_558,
                   (long)&((local_698.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar32);
        iVar19 = std::__cxx11::string::compare
                           ((char *)((long)&((local_698.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar32));
        if (iVar19 == 0) {
          iVar18 = (int)uVar46;
        }
        iVar19 = std::__cxx11::string::compare
                           ((char *)((long)&((local_698.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar32));
        uVar33 = uVar46 & 0xffffffff;
        if (iVar19 != 0) {
          uVar33 = uVar30;
        }
        iVar19 = (int)uVar33;
        iVar20 = std::__cxx11::string::compare(local_558);
        uVar2 = uVar2 + (iVar20 == 0);
        iVar21 = std::__cxx11::string::compare(local_558);
        iVar20 = (int)uVar46;
        if (-1 < (int)local_850) {
          iVar20 = (int)local_850;
        }
        if (iVar21 == 0) {
          local_850._0_4_ = iVar20;
        }
        if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_558._0_8_ != &local_548) {
          operator_delete((void *)local_558._0_8_,
                          (ulong)((long)local_548.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        uVar46 = uVar46 + 1;
        lVar32 = lVar32 + 0x20;
        uVar30 = uVar33;
      } while ((long)uVar46 <
               (long)local_698.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_698.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
      local_850 = (long)(int)local_850;
      this = local_7d8;
    }
    a_level_geom = &(this->super_NavierStokesBase).super_AmrLevel.geom;
    pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
              ((PltFileManager *)local_678,(this->super_NavierStokesBase).super_AmrLevel.level,
               a_level_geom,iVar19,0,3,
               (MultiFab *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
    pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
              ((PltFileManager *)local_678,(this->super_NavierStokesBase).super_AmrLevel.level,
               a_level_geom,iVar18,NavierStokesBase::Temp,1,
               (MultiFab *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
    local_558._0_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1;
    local_558._8_8_ = (Arena *)0x0;
    local_548.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_548.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_548.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_748._0_8_ = &PTR__FabFactory_008378d0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)local_208,&(this->super_NavierStokesBase).super_AmrLevel.grids,
               &(this->super_NavierStokesBase).super_AmrLevel.dmap,uVar2,0,(MFInfo *)local_558,
               (FabFactory<amrex::FArrayBox> *)local_748);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_548);
    pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
              ((PltFileManager *)local_678,(this->super_NavierStokesBase).super_AmrLevel.level,
               a_level_geom,iVar19 + 3,0,uVar2,(MultiFab *)local_208);
    lVar32 = 0;
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_748,
                     "Y(",spec_names_abi_cxx11_.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar32);
      plVar24 = (long *)std::__cxx11::string::append((char *)local_748);
      pvVar26 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(plVar24 + 2);
      if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)*plVar24 == pvVar26) {
        local_548.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pvVar26->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_548.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar24[3];
        local_558._0_8_ = &local_548;
      }
      else {
        local_548.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pvVar26->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_558._0_8_ =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)*plVar24;
      }
      local_558._8_8_ = plVar24[1];
      *plVar24 = (long)pvVar26;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      if ((undefined1 *)local_748._0_8_ != local_738) {
        operator_delete((void *)local_748._0_8_,local_738._0_8_ + 1);
      }
      if ((int)uVar2 < 1) {
LAB_002644b9:
        local_748._0_8_ = (_func_int **)0x0;
        local_748._8_8_ = local_748._8_8_ & 0xffffffff00000000;
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   this_00.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,(int)lVar32 + 4,
                   1,(IntVect *)local_748);
      }
      else {
        uVar30 = 0;
        bVar51 = false;
        lVar47 = local_850 << 5;
        do {
          if (((Arena *)local_558._8_8_ ==
               *(Arena **)
                ((long)&(local_698.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar47)) &&
             (((Arena *)local_558._8_8_ == (Arena *)0x0 ||
              (iVar18 = bcmp((void *)local_558._0_8_,
                             *(void **)((long)&((local_698.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar47),local_558._8_8_),
              iVar18 == 0)))) {
            bVar51 = true;
            amrex::MultiFab::Copy
                      ((MultiFab *)
                       this_00.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                       (MultiFab *)local_208,(int)uVar30,(int)lVar32 + 4,1,0);
          }
          uVar30 = uVar30 + 1;
          lVar47 = lVar47 + 0x20;
        } while (uVar2 != uVar30);
        if (!bVar51) goto LAB_002644b9;
      }
      if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_558._0_8_ != &local_548) {
        operator_delete((void *)local_558._0_8_,
                        (ulong)((long)local_548.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      lVar32 = lVar32 + 1;
    } while (lVar32 != 0x15);
    if (NavierStokesBase::verbose != 0) {
      local_558._8_8_ = amrex::OutStream();
      local_558._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
      local_558._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_548);
      *(undefined8 *)
       ((long)&local_548.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       *(size_type *)
        ((long)local_548.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start - 0x18)) =
           *(undefined8 *)
            ((long)&((ArenaInfo *)(local_558._8_8_ + 8))->release_threshold +
            (long)(*(_func_int ***)local_558._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_548,"initData: finished init from pltfile",0x24);
      local_748[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_548,local_748,1);
      amrex::Print::~Print((Print *)local_558);
    }
    amrex::MFIter::MFIter
              ((MFIter *)local_338,
               (FabArrayBase *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
    if (local_318 < local_310) {
      do {
        amrex::MFIter::tilebox(&local_574,(MFIter *)local_338);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_388,
                   (FabArray<amrex::FArrayBox> *)
                   this_00.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(MFIter *)local_338)
        ;
        iVar21 = local_388.begin.y;
        iVar20 = local_388.begin.x;
        LVar17 = local_388.nstride;
        iVar19 = local_574.bigend.vect[0];
        iVar18 = local_574.smallend.vect[0];
        local_7e0 = (double)(ulong)(uint)local_574.smallend.vect[2];
        local_778 = (double)CONCAT44(local_778._4_4_,local_574.bigend.vect[2]);
        if (local_574.smallend.vect[2] <= local_574.bigend.vect[2]) {
          local_7a0 = (Array4<double> *)prob_parm_d;
          local_760 = (double)CONCAT44(local_388.jstride._4_4_,(undefined4)local_388.jstride);
          local_7c0 = (ulong)local_388.begin.z;
          local_7b0 = (double)CONCAT44(local_7b0._4_4_,local_574.smallend.vect[1]);
          lVar43 = local_388.nstride * 0xd0;
          lVar47 = local_388.nstride * 200;
          local_7b8 = (undefined **)local_388.p;
          local_7e8 = (undefined **)
                      (local_388.p + (local_388.nstride * 4 - (long)local_388.begin.x));
          local_7c8 = -local_7c0;
          local_768 = (double)-(long)local_388.begin.y;
          local_7a8 = (double)CONCAT44(local_7a8._4_4_,local_574.bigend.vect[1]);
          lVar32 = local_388.nstride * 0x18;
          local_780 = (Real)local_388.kstride;
          local_7f0 = (Real)(local_388.kstride * 8);
          local_770 = (double)((long)local_760 * 8);
          do {
            if (local_7b0._0_4_ <= local_7a8._0_4_) {
              local_758 = (ProbParm *)
                          ((local_7c8 + local_7e0._0_4_) * (long)local_7f0 + (long)local_7e8);
              local_5a8._0_8_ =
                   local_7b8 + (long)(local_7e0._0_4_ - (int)local_7c0) * (long)local_780;
              local_818 = (ulong)local_7b0 & 0xffffffff;
              do {
                if (iVar18 <= iVar19) {
                  local_790 = (Real *)((long)&local_758->P_mean +
                                      ((long)local_768 + (long)(int)local_818) * (long)local_770);
                  local_798 = local_5a8._0_8_ +
                              (long)((int)local_818 - iVar21) * (long)local_760 * 8;
                  iVar31 = iVar18;
                  do {
                    pRVar45 = local_790 + iVar31;
                    pRVar50 = local_790 + iVar31;
                    memset(local_2d8,0,0xa8);
                    lVar37 = local_798 + (long)(iVar31 - iVar20) * 8;
                    lVar27 = 0;
                    do {
                      *(Real *)(local_2d8 + (lVar27 * 2 + -4) * 4 + 0x10) = *pRVar50;
                      lVar27 = lVar27 + 1;
                      pRVar50 = pRVar50 + LVar17;
                    } while (lVar27 != 0x15);
                    pdVar3 = local_7a0->p;
                    dVar4 = *(double *)(lVar37 + lVar43);
                    local_748._0_8_ = (_func_int **)0x3fdfbefbefbefbf0;
                    local_748._8_8_ = 0x3fefbefbefbefbf0;
                    local_738._8_8_ = 0x3fa000418a43bf8c;
                    local_738._0_8_ = 0x3fb000418a43bf8c;
                    local_728._8_8_ = 0x3fac6bb6f569cbd9;
                    local_728._0_8_ = 0x3fae1af1b70e12fe;
                    local_718._8_8_ = 0x3fb24021df7a429e;
                    local_718._0_8_ = 0x3f9f065042c3dbd3;
                    local_708._8_8_ = 0x3fb106e55a53f15b;
                    local_708._0_8_ = 0x3fb24021df7a429e;
                    local_6f8 = 0.06233248145608677;
                    dStack_6f0 = 0.035701535166012134;
                    local_6e8 = 0.022722624917630486;
                    dStack_6e0 = 0.03446136880556896;
                    local_6d8 = 0.033304469459801506;
                    dStack_6d0 = 0.032222723464587225;
                    local_6c8 = 0.035645540742853074;
                    dStack_6c0 = 0.034409194136673316;
                    local_6b8 = 0.03325573661456601;
                    dStack_6b0 = 0.03569643749553795;
                    local_6a8 = 0.025031289111389236;
                    lVar27 = 0;
                    do {
                      *(double *)(local_558 + lVar27 * 8) =
                           *(double *)(local_2d8 + (lVar27 * 2 + -4) * 4 + 0x10) *
                           *(double *)(local_748 + lVar27 * 8);
                      lVar27 = lVar27 + 1;
                    } while (lVar27 != 0x15);
                    dVar10 = 0.0;
                    lVar27 = 0;
                    do {
                      dVar10 = dVar10 + *(double *)(local_558 + lVar27 * 8);
                      lVar27 = lVar27 + 1;
                    } while (lVar27 != 0x15);
                    *(double *)(lVar37 + lVar32) =
                         (((double)pdVar3 * 10.0) / (dVar4 * 83144626.1815324 * dVar10)) * 1000.0;
                    dVar4 = *(double *)(lVar37 + lVar43);
                    dVar11 = dVar4 * dVar4;
                    dVar58 = dVar4 * dVar11;
                    dVar10 = dVar4 * dVar58;
                    local_558._0_8_ =
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)0x3fdfbefbefbefbf0;
                    local_558._8_8_ = (Arena *)0x3fefbefbefbefbf0;
                    local_548.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fb000418a43bf8c;
                    local_548.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3fa000418a43bf8c;
                    local_548.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3fae1af1b70e12fe
                    ;
                    dStack_530 = 0.055509297807382736;
                    local_528 = 0.030297521662727988;
                    dStack_520 = 0.07129108148570615;
                    local_518 = 0.07129108148570615;
                    dStack_510 = 0.06651147322913202;
                    local_508 = 0.06233248145608677;
                    dStack_500 = 0.035701535166012134;
                    local_4f8 = 0.022722624917630486;
                    dStack_4f0 = 0.03446136880556896;
                    local_4e8 = 0.033304469459801506;
                    dStack_4e0 = 0.032222723464587225;
                    local_4d8 = 0.035645540742853074;
                    dStack_4d0 = 0.034409194136673316;
                    local_4c8 = 0.03325573661456601;
                    dStack_4c0 = 0.03569643749553795;
                    local_4b8 = 0.025031289111389236;
                    dVar53 = 1.0 / dVar4;
                    if (1000.0 <= dVar4) {
                      local_748._0_8_ =
                           (_func_int **)
                           (dVar53 * -950.158922 +
                           dVar10 * 4.00510752e-15 +
                           dVar58 * -4.48915985e-11 +
                           dVar11 * 1.66485593e-07 + dVar4 * -2.47012365e-05 + 3.3372792);
                      local_748._8_8_ =
                           dVar53 * 25473.6599 +
                           dVar10 * 9.96394714e-23 +
                           dVar58 * -1.18378809e-18 +
                           dVar11 * 5.38539827e-15 + dVar4 * -1.15421486e-11 + 2.50000001;
                      local_738._8_8_ =
                           dVar53 * -1088.45772 +
                           dVar10 * -4.33435588e-15 +
                           dVar58 * 5.23676387e-11 +
                           dVar11 * -2.52655556e-07 + dVar4 * 0.00074154377 + 3.28253784;
                      local_738._0_8_ =
                           dVar53 * 29217.5791 +
                           dVar10 * 2.45667382e-16 +
                           dVar58 * -2.50444497e-12 +
                           dVar11 * 1.39828196e-08 + dVar4 * -4.29870569e-05 + 2.56942078;
                      local_728._8_8_ =
                           dVar53 * -30004.2971 +
                           dVar10 * 3.36401984e-15 +
                           dVar58 * -2.42604967e-11 +
                           dVar11 * -5.46908393e-08 + dVar4 * 0.00108845902 + 3.03399249;
                      local_728._0_8_ =
                           dVar53 * 3858.657 +
                           dVar10 * 2.34824752e-15 +
                           dVar58 * -2.19865389e-11 +
                           dVar11 * 4.21684093e-08 + dVar4 * 0.000274214858 + 3.09288767;
                      local_718._8_8_ =
                           dVar53 * 46263.604 +
                           dVar10 * -3.75455134e-15 +
                           dVar58 * 6.50448872e-11 +
                           dVar11 * -4.69648657e-07 + dVar4 * 0.00182819646 + 2.87410113;
                      local_718._0_8_ =
                           dVar53 * 111.856713 +
                           dVar10 * -2.1581707e-15 +
                           dVar58 * 2.85615925e-11 +
                           dVar11 * -2.11219383e-07 + dVar4 * 0.00111991006 + 4.0172109;
                      local_708._8_8_ =
                           dVar53 * 16775.5843 +
                           dVar10 * -9.34308788e-15 +
                           dVar58 * 1.48921161e-10 +
                           dVar11 * -9.95714493e-07 + dVar4 * 0.00361995018 + 2.28571772;
                      local_708._0_8_ =
                           dVar53 * 50925.9997 +
                           dVar10 * -6.7943273e-15 +
                           dVar58 * 1.044765e-10 +
                           dVar11 * -6.70639823e-07 + dVar4 * 0.00232794318 + 2.29203842;
                      local_6f8 = dVar53 * -9468.34459 +
                                  dVar10 * -2.0363046e-14 +
                                  dVar58 * 3.05731338e-10 +
                                  dVar11 * -1.9109527e-06 + dVar4 * 0.00669547335 + 0.074851495;
                      dStack_6f0 = dVar53 * -14151.8724 +
                                   dVar10 * -4.07295432e-15 +
                                   dVar58 * 5.7513252e-11 +
                                   dVar11 * -3.32941924e-07 + dVar4 * 0.00103126372 + 2.71518561;
                      local_6e8 = dVar53 * -48759.166 +
                                  dVar10 * -9.44168328e-15 +
                                  dVar58 * 1.30872547e-10 +
                                  dVar11 * -7.38271347e-07 + dVar4 * 0.00220718513 + 3.85746029;
                      dStack_6e0 = dVar53 * 4011.91815 +
                                   dVar10 * -1.06701742e-14 +
                                   dVar58 * 1.47290445e-10 +
                                   dVar11 * -8.28152043e-07 + dVar4 * 0.00247847763 + 2.77217438;
                      local_6d8 = dVar53 * -13995.8323 +
                                  dVar10 * -1.76771128e-14 +
                                  dVar58 * 2.5160303e-10 +
                                  dVar11 * -1.47419604e-06 + dVar4 * 0.00460000041 + 1.76069008;
                      dStack_6d0 = dVar53 * 127.83252 +
                                   dVar10 * -4.225232e-15 +
                                   dVar58 * 9.8610775e-11 +
                                   dVar11 * -8.85461333e-07 + dVar4 * 0.0039357485 + 3.770799;
                      local_6c8 = dVar53 * 4939.88614 +
                                  dVar10 * -2.51412122e-14 +
                                  dVar58 * 3.68057308e-10 +
                                  dVar11 * -2.23692638e-06 + dVar4 * 0.00732270755 + 2.03611116;
                      dStack_6c0 = dVar53 * 12857.52 +
                                   dVar10 * -2.99283152e-14 +
                                   dVar58 * 4.38044223e-10 +
                                   dVar11 * -2.66068889e-06 + dVar4 * 0.0086986361 + 1.95465642;
                      local_6b8 = dVar53 * -11426.3932 +
                                  dVar10 * -3.8000578e-14 +
                                  dVar58 * 5.53530003e-10 +
                                  dVar11 * -3.3418689e-06 + dVar4 * 0.0108426339 + 1.0718815;
                      dVar55 = dVar10 * -1.3506702e-15 +
                               dVar58 * 2.5242595e-11 +
                               dVar11 * -1.89492e-07 + dVar4 * 0.0007439884 + 2.92664;
                      dVar54 = dVar53 * -922.7977;
                    }
                    else {
                      local_748._0_8_ =
                           (_func_int **)
                           (dVar53 * -917.935173 +
                           dVar10 * -1.47522352e-12 +
                           dVar58 * 5.03930235e-09 +
                           dVar11 * -6.492717e-06 + dVar4 * 0.00399026037 + 2.34433112);
                      local_748._8_8_ =
                           dVar53 * 25473.6599 +
                           dVar10 * -1.85546466e-22 +
                           dVar58 * 5.7520408e-19 +
                           dVar11 * -6.65306547e-16 + dVar4 * 3.52666409e-13 + 2.5;
                      local_738._8_8_ =
                           dVar53 * -1063.94356 +
                           dVar10 * 6.48745674e-13 +
                           dVar58 * -2.42032377e-09 +
                           dVar11 * 3.282434e-06 + dVar4 * -0.00149836708 + 3.78245636;
                      local_738._0_8_ =
                           dVar53 * 29122.2592 +
                           dVar10 * 4.22531942e-13 +
                           dVar58 * -1.53201656e-09 +
                           dVar11 * 2.21435465e-06 + dVar4 * -0.00163965942 + 3.1682671;
                      local_728._8_8_ =
                           dVar53 * -30293.7267 +
                           dVar10 * 3.54395634e-13 +
                           dVar58 * -1.37199266e-09 +
                           dVar11 * 2.17346737e-06 + dVar4 * -0.00101821705 + 4.19864056;
                      local_728._0_8_ =
                           dVar53 * 3615.08056 +
                           dVar10 * 2.7282294e-13 +
                           dVar58 * -9.70283332e-10 +
                           dVar11 * 1.5393128e-06 + dVar4 * -0.00120065876 + 3.99201543;
                      local_718._8_8_ =
                           dVar53 * 46004.0401 +
                           dVar10 * 3.37483438e-13 +
                           dVar58 * -9.62727883e-10 +
                           dVar11 * 9.31632803e-07 + dVar4 * 0.000484436072 + 3.76267867;
                      local_718._0_8_ =
                           dVar53 * 294.80804 +
                           dVar10 * 1.85845025e-12 +
                           dVar58 * -6.06909735e-09 +
                           dVar11 * 7.05276303e-06 + dVar4 * -0.00237456025 + 4.30179801;
                      local_708._8_8_ =
                           dVar53 * 16444.9988 +
                           dVar10 * 5.08771468e-13 +
                           dVar58 * -1.71779356e-09 +
                           dVar11 * 1.91007285e-06 + dVar4 * 0.00100547588 + 3.6735904;
                      local_708._0_8_ =
                           dVar53 * 50496.8163 +
                           dVar10 * 3.88629474e-13 +
                           dVar58 * -1.67203995e-09 +
                           dVar11 * 2.74432073e-06 + dVar4 * -0.0011833071 + 4.19860411;
                      local_6f8 = dVar53 * -10246.6476 +
                                  dVar10 * 3.33387912e-12 +
                                  dVar58 * -1.21185757e-08 +
                                  dVar11 * 1.63933533e-05 + dVar4 * -0.0068354894 + 5.14987613;
                      dStack_6f0 = dVar53 * -14344.086 +
                                   dVar10 * -1.808849e-13 +
                                   dVar58 * 2.26751471e-10 +
                                   dVar11 * 3.3893811e-07 + dVar4 * -0.00030517684 + 3.57953347;
                      local_6e8 = dVar53 * -48371.9697 +
                                  dVar10 * -2.87399096e-14 +
                                  dVar58 * 6.14797555e-10 +
                                  dVar11 * -2.3745209e-06 + dVar4 * 0.00449229839 + 2.35677352;
                      dStack_6e0 = dVar53 * 3839.56496 +
                                   dVar10 * 8.6753773e-13 +
                                   dVar58 * -3.32860233e-09 +
                                   dVar11 * 4.59331487e-06 + dVar4 * -0.00162196266 + 4.22118584;
                      local_6d8 = dVar53 * -14308.9567 +
                                  dVar10 * 2.63545304e-12 +
                                  dVar58 * -9.48213152e-09 +
                                  dVar11 * 1.24406669e-05 + dVar4 * -0.00495416684 + 4.79372315;
                      dStack_6d0 = dVar53 * 978.6011 +
                                   dVar10 * 4.15122e-13 +
                                   dVar58 * -1.844409e-09 +
                                   dVar11 * 1.77949067e-06 + dVar4 * 0.0036082975 + 2.106204;
                      local_6c8 = dVar53 * 5089.77593 +
                                  dVar10 * 5.39768746e-12 +
                                  dVar58 * -1.72897188e-08 +
                                  dVar11 * 1.90330097e-05 + dVar4 * -0.00378526124 + 3.95920148;
                      dStack_6c0 = dVar53 * 12841.6265 +
                                   dVar10 * 4.61018008e-12 +
                                   dVar58 * -1.49781651e-08 +
                                   dVar11 * 1.65714269e-05 + dVar4 * -0.00209329446 + 4.30646568;
                      local_6b8 = dVar53 * -11522.2055 +
                                  dVar10 * 5.37371542e-12 +
                                  dVar58 * -1.77116571e-08 +
                                  dVar11 * 1.99812763e-05 + dVar4 * -0.00275077135 + 4.29142492;
                      dVar55 = dVar10 * -4.889708e-13 +
                               dVar58 * 1.41037875e-09 +
                               dVar11 * -1.321074e-06 + dVar4 * 0.0007041202 + 3.298677;
                      dVar54 = dVar53 * -1020.8999;
                    }
                    dStack_6b0 = dVar54 + dVar55;
                    local_6a8 = dVar53 * -745.375 +
                                dVar10 * 0.0 + dVar58 * 0.0 + dVar11 * 0.0 + dVar4 * 0.0 + 2.5;
                    lVar27 = 0;
                    do {
                      *(double *)(local_748 + lVar27 * 8) =
                           *(double *)(local_558 + lVar27 * 8) * dVar4 * 83144626.1815324 *
                           *(double *)(local_748 + lVar27 * 8);
                      lVar27 = lVar27 + 1;
                    } while (lVar27 != 0x15);
                    *(undefined8 *)(lVar37 + lVar47) = 0;
                    dVar4 = 0.0;
                    lVar27 = 0;
                    do {
                      dVar4 = dVar4 + *(double *)(local_2d8 + (lVar27 * 2 + -4) * 4 + 0x10) *
                                      *(double *)(local_748 + lVar27 * 8);
                      lVar27 = lVar27 + 1;
                    } while (lVar27 != 0x15);
                    *(double *)(lVar37 + lVar47) = dVar4;
                    *(double *)(lVar37 + lVar47) = dVar4 * 0.0001 * *(double *)(lVar37 + lVar32);
                    lVar27 = 0;
                    do {
                      *pRVar45 = *(double *)(local_2d8 + (lVar27 * 2 + -4) * 4 + 0x10) *
                                 *(double *)(lVar37 + lVar32);
                      lVar27 = lVar27 + 1;
                      pRVar45 = pRVar45 + LVar17;
                    } while (lVar27 != 0x15);
                    bVar51 = iVar31 != iVar19;
                    iVar31 = iVar31 + 1;
                  } while (bVar51);
                }
                bVar51 = (int)local_818 != local_7a8._0_4_;
                local_818 = (ulong)((int)local_818 + 1);
              } while (bVar51);
            }
            iVar31 = SUB84(local_7e0,0);
            local_7e0 = (double)(ulong)(iVar31 + 1);
          } while (iVar31 != local_778._0_4_);
        }
        amrex::MFIter::operator++((MFIter *)local_338);
      } while (local_318 < local_310);
    }
    amrex::MFIter::~MFIter((MFIter *)local_338);
    amrex::MultiFab::~MultiFab((MultiFab *)local_208);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_228);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_698);
    std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~vector(&local_5c8);
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
              (&vStack_5e0);
    if ((pointer)local_5f8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_5f8._0_8_,(long)local_5e8 - local_5f8._0_8_);
    }
    this = local_7d8;
    if (pGStack_610 != (pointer)0x0) {
      operator_delete(pGStack_610,(long)pGStack_600 - (long)pGStack_610);
    }
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_628);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_650);
    if ((undefined1 *)local_678._0_8_ != local_678 + 0x10) {
      operator_delete((void *)local_678._0_8_,local_678._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_810._M_dataplus._M_p != &local_810.field_2) {
      operator_delete(local_810._M_dataplus._M_p,
                      CONCAT71(local_810.field_2._M_allocated_capacity._1_7_,
                               local_810.field_2._M_local_buf[0]) + 1);
    }
  }
  local_558._0_8_ = &local_548;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"1D","");
  local_208._0_8_ = local_208 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"1D_S","");
  showMFsub((string *)local_558,
            (MultiFab *)
            this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
            _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&stripBox,
            (string *)local_208,(this->super_NavierStokesBase).super_AmrLevel.level,-1);
  if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
    operator_delete((void *)local_208._0_8_,local_1f8[0]._M_allocated_capacity + 1);
  }
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_558._0_8_ != &local_548) {
    operator_delete((void *)local_558._0_8_,
                    (ulong)((long)local_548.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  pSVar6 = (this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar22 = amrex::StateDescriptor::timeType(pSVar6[1].desc);
  if (TVar22 == Point) {
    RVar8 = pSVar6[1].new_time.stop;
  }
  else {
    RVar8 = (pSVar6[1].new_time.start + pSVar6[1].new_time.stop) * 0.5;
  }
  NavierStokesBase::computeGradP(&this->super_NavierStokesBase,RVar8);
  local_748._0_8_ = local_738;
  local_748._8_8_ = 0;
  auVar14[0xf] = 0;
  auVar14._0_15_ = local_738._1_15_;
  local_738 = auVar14 << 8;
  amrex::ParmParse::query(&local_88,"initVelocityPlt",(string *)local_748,0);
  if (local_748._8_8_ != 0) {
    if (NavierStokesBase::verbose != 0) {
      local_558._8_8_ = amrex::OutStream();
      local_558._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
      local_558._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_548);
      *(undefined8 *)
       ((long)&local_548.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       *(size_type *)
        ((long)local_548.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start - 0x18)) =
           *(undefined8 *)
            ((long)&((ArenaInfo *)(local_558._8_8_ + 8))->release_threshold +
            (long)(*(_func_int ***)local_558._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_548,"initData: reading velocity from: ",0x21);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_548,(char *)local_748._0_8_,local_748._8_8_);
      local_208[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_548,local_208,1);
      amrex::Print::~Print((Print *)local_558);
    }
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3c8,local_748._0_8_,(char *)(local_748._0_8_ + local_748._8_8_));
    pele::physics::pltfilemanager::PltFileManager::PltFileManager
              ((PltFileManager *)local_678,&local_3c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2d8,&vStack_650);
    local_338._0_8_ =
         (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
    local_338._8_8_ = (FabArrayBase *)0x0;
    stack0xfffffffffffffcd8 = (pointer)0x0;
    pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
              ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_338);
    uVar30 = 0xffffffff;
    iVar18 = -1;
    if (local_2d8._8_8_ != local_2d8._0_8_ && -1 < (long)(local_2d8._8_8_ - local_2d8._0_8_)) {
      lVar32 = 0;
      uVar46 = 0;
      do {
        iVar18 = std::__cxx11::string::compare((char *)(local_2d8._0_8_ + lVar32));
        if (iVar18 == 0) {
          uVar30 = uVar46 & 0xffffffff;
        }
        iVar18 = (int)uVar30;
        uVar46 = uVar46 + 1;
        lVar32 = lVar32 + 0x20;
      } while ((long)uVar46 < (long)(local_2d8._8_8_ - local_2d8._0_8_) >> 5);
    }
    if (iVar18 == -1) {
      amrex::Abort_host("Could not find velocity fields in supplied peleLM.initVelocityPlt");
    }
    local_558._0_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1;
    local_558._8_8_ = (Arena *)0x0;
    local_548.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_548.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_548.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_388.p = (double *)&PTR__FabFactory_008378d0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)local_208,
               (BoxArray *)
               ((long)this_00.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8),
               (DistributionMapping *)
               ((long)this_00.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0x70),1,0,
               (MFInfo *)local_558,(FabFactory<amrex::FArrayBox> *)&local_388);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_548);
    pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
              ((PltFileManager *)local_678,(local_7d8->super_NavierStokesBase).super_AmrLevel.level,
               &(local_7d8->super_NavierStokesBase).super_AmrLevel.geom,iVar18,0,3,
               (MultiFab *)local_208);
    amrex::MultiFab::Add
              ((MultiFab *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(MultiFab *)local_208,0,
               0,3,0);
    this = local_7d8;
    if (NavierStokesBase::verbose != 0) {
      local_558._8_8_ = amrex::OutStream();
      local_558._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
      local_558._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_548);
      *(undefined8 *)
       ((long)&local_548.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       *(size_type *)
        ((long)local_548.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start - 0x18)) =
           *(undefined8 *)
            ((long)&((ArenaInfo *)(local_558._8_8_ + 8))->release_threshold +
            (long)(*(_func_int ***)local_558._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_548,"initData: finished init from peleLM.initVelocityPlt",0x33);
      local_388.p = (double *)CONCAT71(local_388.p._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_548,(char *)&local_388,1)
      ;
      amrex::Print::~Print((Print *)local_558);
    }
    amrex::MultiFab::~MultiFab((MultiFab *)local_208);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_338);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2d8);
    std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~vector(&local_5c8);
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
              (&vStack_5e0);
    if ((pointer)local_5f8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_5f8._0_8_,(long)local_5e8 - local_5f8._0_8_);
    }
    if (pGStack_610 != (pointer)0x0) {
      operator_delete(pGStack_610,(long)pGStack_600 - (long)pGStack_610);
    }
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_628);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_650);
    if ((undefined1 *)local_678._0_8_ != local_678 + 0x10) {
      operator_delete((void *)local_678._0_8_,local_678._16_8_ + 1);
    }
  }
  NavierStokesBase::make_rho_prev_time(&this->super_NavierStokesBase);
  NavierStokesBase::make_rho_curr_time(&this->super_NavierStokesBase);
  initDataOtherTypes(this);
  NavierStokesBase::set_body_state
            (&this->super_NavierStokesBase,
             (MultiFab *)
             this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
  set_typical_values(this,false);
  init_mixture_fraction();
  initActiveControl(this);
  NavierStokesBase::InitialRedistribution(&this->super_NavierStokesBase);
  NavierStokesBase::set_body_state
            (&this->super_NavierStokesBase,
             (MultiFab *)
             this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
  if (NavierStokesBase::have_divu != 0) {
    lVar32 = (long)NavierStokesBase::Divu_Type;
    pSVar6 = (this->super_NavierStokesBase).super_AmrLevel.state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    TVar22 = amrex::StateDescriptor::timeType(pSVar6[lVar32].desc);
    if (TVar22 == Point) {
      RVar8 = pSVar6[lVar32].new_time.stop;
    }
    else {
      RVar8 = (pSVar6[lVar32].new_time.start + pSVar6[lVar32].new_time.stop) * 0.5;
    }
    this_02 = (this->super_NavierStokesBase).super_AmrLevel.state.
              super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
              super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar7 = this_02[NavierStokesBase::Divu_Type].new_data._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    amrex::StateData::setTimeLevel(this_02,RVar8,1.0,1.0);
    amrex::AmrLevel::FillPatch
              ((AmrLevel *)this,
               (MultiFab *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
               ((IntVect *)
               ((long)this_00.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->vect
               [0],RVar8,0,3,NavierStokesBase::NUM_STATE + -4,3);
    (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x2f])(SUB84(RVar8,0),this);
    (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x2d])
              (SUB84(RVar8,0),0,this,pMVar7);
  }
  pBVar34 = &(this->super_NavierStokesBase).super_AmrLevel.grids;
  pBVar38 = &(this->super_NavierStokesBase).old_intersect_new;
  for (lVar32 = 9; lVar32 != 0; lVar32 = lVar32 + -1) {
    *(undefined8 *)&pBVar38->m_bat = *(undefined8 *)&pBVar34->m_bat;
    pBVar34 = (BoxArray *)((long)pBVar34 + (ulong)bVar52 * -0x10 + 8);
    pBVar38 = (BoxArray *)((long)pBVar38 + (ulong)bVar52 * -0x10 + 8);
  }
  (this->super_NavierStokesBase).old_intersect_new.m_ref.
  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_NavierStokesBase).super_AmrLevel.grids.m_ref.
       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_NavierStokesBase).old_intersect_new.m_ref.
              super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(this->super_NavierStokesBase).super_AmrLevel.grids.m_ref.
              super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_NavierStokesBase).old_intersect_new.m_simplified_list.
  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_NavierStokesBase).super_AmrLevel.grids.m_simplified_list.
       super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_NavierStokesBase).old_intersect_new.m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(this->super_NavierStokesBase).super_AmrLevel.grids.m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((undefined1 *)local_748._0_8_ != local_738) {
    operator_delete((void *)local_748._0_8_,local_738._0_8_ + 1);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88);
  return;
}

Assistant:

void
PeleLM::initData ()
{
  //
  // Copy problem parameters into device copy
  //
  Gpu::copy(Gpu::hostToDevice, prob_parm, prob_parm+1,
            prob_parm_d);

  //
  // Initialize the state and the pressure.
  //
  MultiFab&   S_new    = get_new_data(State_Type);
  MultiFab&   P_new    = get_new_data(Press_Type);

  // If the user provide an initDataPlt, fill the data from there.
  ParmParse pp("peleLM");
  if (pp.countval("initDataPlt") > 0) {

    //
    // This code has a few drawbacks.  It assumes that the physical
    // domain size of the current problem is the same as that of the
    // one that generated the pltfile.  It also assumes that the pltfile
    // has at least as many levels as does the current problem.  If
    // either of these are false this code is likely to core dump.
    //
    S_new.setVal(0.0);
    P_new.setVal(0.0);

    std::string pltfile;
    pp.query("initDataPlt", pltfile);
    if (verbose)
      amrex::Print() << "initData: reading data from: " << pltfile << '\n';

    // Use PelePhysics PltFileManager
    pele::physics::pltfilemanager::PltFileManager pltData(pltfile); 
    Vector<std::string>  plotnames   = pltData.getVariableList();

    // Find required data in pltfile
    Vector<std::string> names;
    pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(names);

    int idT = -1, idX = -1, idY = -1, nSpecPlt = 0;
    for (int i = 0; i < plotnames.size(); ++i)
    {
      std::string firstChars = plotnames[i].substr(0, 2);
      if (plotnames[i] == "temp")       idT = i;
      if (plotnames[i] == "x_velocity") idX = i;
      if (firstChars == "Y(")     nSpecPlt += 1;
      if (firstChars == "Y(" && idY < 0 ) {  // species might not be ordered in the order of the current mech.
        idY = i;
      }
    }
    //
    // In the plotfile the mass fractions directly follow the velocities.
    //
    int idSpec = idX + AMREX_SPACEDIM;
 
    // Velocity
    pltData.fillPatchFromPlt(level, geom, idX, Xvel, AMREX_SPACEDIM,
                             S_new);

    // Temperature
    pltData.fillPatchFromPlt(level, geom, idT, Temp, 1,
                             S_new);

    // Species
    // Hold the species in temporary MF before copying to level data
    // in case the number of species differs.
    MultiFab speciesPlt(grids, dmap, nSpecPlt, 0); 
    pltData.fillPatchFromPlt(level, geom, idSpec, 0, nSpecPlt,
                             speciesPlt);
    for (int i = 0; i < NUM_SPECIES; i++) {
       std::string specString = "Y("+spec_names[i]+")";
       int foundSpec = 0;
       for (int iplt = 0; iplt < nSpecPlt; iplt++) {
          if ( specString == plotnames[idY+iplt] ) {
             MultiFab::Copy(S_new, speciesPlt, iplt, DEF_first_spec+i, 1, 0);
             foundSpec = 1;
          }
       }
       if (!foundSpec) S_new.setVal(0.0,DEF_first_spec+i,1);
    }

    if (verbose) amrex::Print() << "initData: finished init from pltfile" << '\n';

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(S_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
      const Box& box = mfi.tilebox();
      auto const& snew_arr = S_new.array(mfi);
      ProbParm const* lprobparm = prob_parm_d;

      amrex::ParallelFor(box,
      [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
        amrex::Real massfrac[NUM_SPECIES] = {0.0};
        for (int n = 0; n < NUM_SPECIES; n++) {
          massfrac[n] = snew_arr(i,j,k,DEF_first_spec+n);
        }
        auto eos = pele::physics::PhysicsType::eos();

        amrex::Real rho_cgs, P_cgs;
        P_cgs = lprobparm->P_mean * 10.0;

        eos.PYT2R(P_cgs, massfrac, snew_arr(i,j,k,DEF_Temp), rho_cgs);
        snew_arr(i,j,k,Density) = rho_cgs * 1.0e3;            // CGS -> MKS conversion

        eos.TY2H(snew_arr(i,j,k,DEF_Temp), massfrac, snew_arr(i,j,k,DEF_RhoH));
        snew_arr(i,j,k,DEF_RhoH) = snew_arr(i,j,k,DEF_RhoH) * 1.0e-4 * snew_arr(i,j,k,Density);   // CGS -> MKS conversion

        for (int n = 0; n < NUM_SPECIES; n++) {
          snew_arr(i,j,k,DEF_first_spec+n) = massfrac[n] * snew_arr(i,j,k,Density);
        }
      });
    }
  }
  else {
    const auto geomdata = geom.data();
    S_new.setVal(0.0);
    P_new.setVal(0.0);

    ProbParm const* lprobparm = prob_parm_d;
    pele::physics::PMF::PmfData::DataContainer const* lpmfdata = pmf_data.getDeviceData();

    auto const& sma = S_new.arrays();
    amrex::ParallelFor(S_new,
    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
    {
       pelelm_initdata(i, j, k, sma[box_no], geomdata, *lprobparm, lpmfdata);
    });
  }

  showMFsub("1D",S_new,stripBox,"1D_S",level);

  //
  // Initialize GradP
  //
  computeGradP(state[Press_Type].curTime());

  //
  // We might want to add the velocity from the supplied plotfile
  // to what we already put into the velocity field via init_data
  //
  std::string velocity_plotfile;
  pp.query("initVelocityPlt", velocity_plotfile);

  if (!velocity_plotfile.empty()) {
    if (verbose)
      amrex::Print() << "initData: reading velocity from: " << velocity_plotfile << '\n';

    // Use PelePhysics PltFileManager
    pele::physics::pltfilemanager::PltFileManager pltData(velocity_plotfile); 
    Vector<std::string>  plotnames   = pltData.getVariableList();

    // Find required data in pltfile
    Vector<std::string> names;
    pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(names);

    int idX = -1;
    for (int i = 0; i < plotnames.size(); ++i)
    {
      if (plotnames[i] == "x_velocity") idX = i;
    }
    if (idX == -1)
      amrex::Abort("Could not find velocity fields in supplied peleLM.initVelocityPlt");
 
    MultiFab tmp(S_new.boxArray(), S_new.DistributionMap(), 1, 0);

    // Velocity
    pltData.fillPatchFromPlt(level, geom, idX, 0, AMREX_SPACEDIM,
                             tmp);
    MultiFab::Add(S_new,tmp,0,Xvel,AMREX_SPACEDIM,0);

    if (verbose)
      amrex::Print() << "initData: finished init from peleLM.initVelocityPlt" << '\n';
  }

  make_rho_prev_time();
  make_rho_curr_time();

  //
  // Initialize other types (RhoRT, divu, ...)
  //
  initDataOtherTypes();

  // Initialize state for EB covered regions.
#ifdef AMREX_USE_EB
  set_body_state(S_new);
#endif

  //
  // Load typical values for each state component
  //
  set_typical_values(false);

  //
  // Initialize mixture fraction data.
  //
  init_mixture_fraction();

  //
  // Initialize active control
  //
  initActiveControl();

#ifdef AMREX_USE_EB
  //
  // Perform redistribution on initial fields
  // This changes the input velocity fields
  //
  InitialRedistribution();
  set_body_state(S_new);
#endif

  //
  // Initialize divU
  //
  if (have_divu)
  {
    const Real dt       = 1.0;
    const Real dtin     = -1.0; // Dummy value denotes initialization.
    const Real new_time = state[Divu_Type].curTime();
    MultiFab&  Divu_new = get_new_data(Divu_Type);

    state[State_Type].setTimeLevel(new_time, dt, dt);

    // calcDiff uses class state and assumes FillPatched -> do it now
    FillPatch(*this, S_new, S_new.nGrow(), new_time , State_Type, Density, NUM_STATE-(Density+1), Density);
    calcDiffusivity(new_time);

    calc_divu(new_time, dtin, Divu_new);
  }

  old_intersect_new = grids;

#ifdef AMREX_PARTICLES
  NavierStokesBase::initParticleData();
#endif
}